

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O2

void __thiscall glcts::GeometryShaderAdjacency::initTest(GeometryShaderAdjacency *this)

{
  char *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar6;
  char **sh2_body_parts;
  bool bVar7;
  undefined8 uVar8;
  char *vsCode;
  char *gsCode;
  char *fsCode;
  char *varyings [2];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
               ,0x110);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x114);
    fsCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    pcVar1 = this->m_test_data->m_gs_code;
    vsCode = 
    "${VERSION}\n\nprecision highp float;\n\nlayout(location = 0) in vec2 position_data;\n\nvoid main()\n{\n    gl_Position = vec4(position_data, 0, 1);\n}\n"
    ;
    gsCode = pcVar1;
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_gs_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3c8))();
    this->m_po_id = GVar4;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error creating program/shader objects.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x121);
    if (this->m_test_data->m_gs_code == (char *)0x0) {
      varyings[0] = "gl_Position";
      GVar4 = this->m_po_id;
      uVar8 = 1;
    }
    else {
      varyings[0] = "out_adjacent_geometry";
      varyings[1]._0_4_ = 0x17cdff5;
      varyings[1]._4_4_ = 0;
      GVar4 = this->m_po_id;
      uVar8 = 2;
    }
    (**(code **)(lVar5 + 0x14c8))(GVar4,uVar8,varyings,0x8c8d);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error configuring vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x130);
    bVar7 = pcVar1 != (char *)0x0;
    GVar4 = 0;
    if (bVar7) {
      GVar4 = this->m_gs_id;
    }
    sh2_body_parts = &gsCode;
    if (!bVar7) {
      sh2_body_parts = (char **)0x0;
    }
    bVar7 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&fsCode,GVar4,
                       (uint)bVar7,sh2_body_parts,this->m_vs_id,1,&vsCode,(bool *)0x0);
    if (bVar7) {
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_vertex_data_bo_id);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_adjacency_geometry_bo_id);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_geometry_bo_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_adjacency_geometry_bo_id);
      (**(code **)(lVar5 + 0x150))(0x8892,this->m_test_data->m_geometry_bo_size << 2,0,0x88e8);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_geometry_bo_id);
      (**(code **)(lVar5 + 0x150))(0x8892,this->m_test_data->m_geometry_bo_size << 2,0,0x88e8);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_vertex_data_bo_id);
      (**(code **)(lVar5 + 0x150))
                (0x8892,this->m_test_data->m_vertex_data_bo_size,this->m_test_data->m_vertex_data,
                 0x88e8);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error configuring vertex buffer objects for vertex data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                      ,0x147);
      if (this->m_test_data->m_index_data_bo_size != 0) {
        (**(code **)(lVar5 + 0x6c8))(1,&this->m_index_data_bo_id);
        (**(code **)(lVar5 + 0x40))(0x8893,this->m_index_data_bo_id);
        (**(code **)(lVar5 + 0x150))
                  (0x8893,this->m_test_data->m_index_data_bo_size,this->m_test_data->m_index_data,
                   0x88e8);
        (**(code **)(lVar5 + 0x40))(0x8893,0);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"Error configuring vertex buffer objects for index data!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                        ,0x152);
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program object from a valid shader!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
               ,0x136);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderAdjacency::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	/* Get shader code */
	const char* fsCode = getFragmentShaderCode();
	const char* gsCode = m_test_data.m_gs_code;
	const char* vsCode = getVertexShaderCode();

	/* Create shader and program objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program/shader objects.");

	/* If gs code is available set gs out data for transformfeedback*/
	if (m_test_data.m_gs_code)
	{
		const char* varyings[] = { "out_adjacent_geometry", "out_geometry" };

		gl.transformFeedbackVaryings(m_po_id, 2, varyings, GL_SEPARATE_ATTRIBS);
	}
	else
	{
		const char* varyings[] = { "gl_Position" };

		gl.transformFeedbackVaryings(m_po_id, 1, varyings, GL_SEPARATE_ATTRIBS);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Build program */
	if (!buildProgram(m_po_id, m_fs_id, 1, /* parts */ &fsCode, (gsCode) ? m_gs_id : 0, (gsCode) ? 1 : 0,
					  (gsCode) ? &gsCode : 0, m_vs_id, 1, /* parts */ &vsCode))
	{
		TCU_FAIL("Could not create a program object from a valid shader!");
	}

	/* Generate buffers for input/output vertex data */
	gl.genBuffers(1, &m_vertex_data_bo_id);
	gl.genBuffers(1, &m_adjacency_geometry_bo_id);
	gl.genBuffers(1, &m_geometry_bo_id);

	/* Configure buffers for input/output vertex data */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_adjacency_geometry_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_geometry_bo_size * 4, 0, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_geometry_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_geometry_bo_size * 4, 0, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_data_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_vertex_data_bo_size, m_test_data.m_vertex_data, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex buffer objects for vertex data!");

	/* Configure buffer for index data */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.genBuffers(1, &m_index_data_bo_id);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_data_bo_id);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, m_test_data.m_index_data_bo_size, m_test_data.m_index_data,
					  GL_DYNAMIC_DRAW);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex buffer objects for index data!");
	}
}